

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_3c2cca::SyncFixture::read(SyncFixture *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  value_reference_type ppVar2;
  ssize_t sVar3;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  undefined4 extraout_var;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  undefined4 in_register_00000034;
  char *message;
  database *db;
  pointer *__ptr;
  shared_ptr<const_char> value;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  undefined1 local_228 [8];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_220;
  AssertHelper local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  _Head_base<0UL,_pstore::system_page_size_interface_*,_false> local_208;
  undefined1 local_200 [232];
  undefined1 local_118 [240];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
  *local_28;
  
  db = &this->db_;
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_210,db,true);
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::find<std::__cxx11::string,void>
            ((const_iterator *)(local_118 + 8),
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)local_210._M_pi,db,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,__fd));
  memset(local_200 + 8,0,0xd8);
  local_200._224_8_ = local_210._M_pi;
  local_118._0_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
        *)0x0;
  local_200._0_8_ = db;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<true>,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>::iterator_base<true>>
            ((internal *)local_228,"it","index->cend (db_)",(iterator_base<true> *)(local_118 + 8),
             (iterator_base<true> *)local_200);
  if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
       *)local_118._0_8_ !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                  *)local_118,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                  *)local_118._0_8_);
  }
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if ((__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )local_220._M_head_impl ==
        (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)local_220._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sync.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    sVar3 = extraout_RAX_01;
    if ((factory *)local_200._0_8_ != (factory *)0x0) {
      iVar1 = (*(*(_func_int ***)local_200._0_8_)[1])();
      sVar3 = CONCAT44(extraout_var,iVar1);
    }
    if (local_220._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_220._M_head_impl);
      sVar3 = extraout_RAX_02;
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_220._M_head_impl);
    }
    ppVar2 = pstore::index::
             hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::iterator_base<true>::operator*((iterator_base<true> *)(local_118 + 8));
    pstore::database::getro<char,void>((database *)local_228,(extent<char> *)db);
    local_200._0_8_ = (factory *)(local_200 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,CONCAT71(local_228._1_7_,local_228[0]),
               (ppVar2->second).size + CONCAT71(local_228._1_7_,local_228[0]));
    sVar3 = std::__cxx11::string::operator=((string *)__buf,(string *)local_200);
    if ((factory *)local_200._0_8_ != (factory *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_,
                      (ulong)((long)&((__shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                                       *)local_200._16_8_)->_M_ptr + 1));
      sVar3 = extraout_RAX;
    }
    if ((tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         )local_220._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_head_impl);
      sVar3 = extraout_RAX_00;
    }
  }
  if (local_28 !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                  *)&local_28,local_28);
    sVar3 = extraout_RAX_03;
  }
  if ((_Head_base<0UL,_pstore::system_page_size_interface_*,_false>)local_208._M_head_impl !=
      (_Head_base<0UL,_pstore::system_page_size_interface_*,_false>)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_head_impl);
    sVar3 = extraout_RAX_04;
  }
  return sVar3;
}

Assistant:

void SyncFixture::read (std::string const & key, std::string * value_out) {
        auto index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        auto const it = index->find (db_, key);
        ASSERT_NE (it, index->cend (db_));

        pstore::extent<char> const & r = it->second;
        std::shared_ptr<char const> value = db_.getro (r);
        *value_out = std::string{value.get (), r.size};
    }